

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O2

void subblock_test(void)

{
  btree_result bVar1;
  int iVar2;
  int iVar3;
  btree_kv_ops *kv_ops;
  filemgr_ops *pfVar4;
  filemgr *pfVar5;
  btree_blk_ops *pbVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  char *__format;
  ulong uVar11;
  ulong uVar12;
  btree *btree_00;
  long lVar13;
  filemgr_open_result fVar14;
  int local_1288;
  btree_meta meta;
  btree btree;
  btreeblk_handle bhandle;
  filemgr_config local_11a8;
  timeval __test_begin;
  char keybuf [256];
  char valuebuf [256];
  char temp [256];
  btree btree_arr [64];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  local_11a8.flag = 0;
  local_11a8.chunksize = 0;
  local_11a8.prefetch_duration = 0;
  local_11a8.encryption_key.bytes[0] = '\0';
  local_11a8.encryption_key.bytes[1] = '\0';
  local_11a8.encryption_key.bytes[2] = '\0';
  local_11a8.encryption_key.bytes[3] = '\0';
  local_11a8.encryption_key.bytes[4] = '\0';
  local_11a8.encryption_key.bytes[5] = '\0';
  local_11a8.encryption_key.bytes[6] = '\0';
  local_11a8.encryption_key.bytes[7] = '\0';
  local_11a8.encryption_key.bytes[8] = '\0';
  local_11a8.encryption_key.bytes[9] = '\0';
  local_11a8.encryption_key.bytes[10] = '\0';
  local_11a8.encryption_key.bytes[0xb] = '\0';
  local_11a8.encryption_key.bytes[0xc] = '\0';
  local_11a8.encryption_key.bytes[0xd] = '\0';
  local_11a8.encryption_key.bytes[0xe] = '\0';
  local_11a8.encryption_key.bytes[0xf] = '\0';
  local_11a8.encryption_key.bytes[0x10] = '\0';
  local_11a8.encryption_key.bytes[0x11] = '\0';
  local_11a8.encryption_key.bytes[0x12] = '\0';
  local_11a8.encryption_key.bytes[0x13] = '\0';
  local_11a8.encryption_key.bytes[0x14] = '\0';
  local_11a8.encryption_key.bytes[0x15] = '\0';
  local_11a8.encryption_key.bytes[0x16] = '\0';
  local_11a8.encryption_key.bytes[0x17] = '\0';
  local_11a8.encryption_key.bytes[0x18] = '\0';
  local_11a8.encryption_key.bytes[0x19] = '\0';
  local_11a8.encryption_key.bytes[0x1a] = '\0';
  local_11a8.encryption_key.bytes[0x1b] = '\0';
  local_11a8.encryption_key.bytes[0x1c] = '\0';
  local_11a8.encryption_key.bytes[0x1d] = '\0';
  local_11a8.encryption_key.bytes[0x1e] = '\0';
  local_11a8.encryption_key.bytes[0x1f] = '\0';
  local_11a8.do_not_cache_doc_blocks = false;
  local_11a8._89_3_ = 0;
  local_11a8.num_blocks_readahead = 0;
  local_11a8.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_11a8.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_11a8.blocksize = 0x1000;
  local_11a8.ncacheblock = 0;
  local_11a8.options = '\b';
  local_11a8.seqtree_opt = '\0';
  local_11a8._18_6_ = 0;
  local_11a8.num_wal_shards = 8;
  local_11a8.num_bcache_shards = 0;
  local_11a8.encryption_key.algorithm = 0;
  kv_ops = btree_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  system("rm -rf  btreeblock_testfile");
  pfVar4 = get_filemgr_ops();
  fVar14 = filemgr_open("./btreeblock_testfile",pfVar4,&local_11a8,(err_log_callback *)0x0);
  pfVar5 = fVar14.file;
  meta.data = malloc(0x1000);
  meta.size = 0x78;
  btreeblk_init(&bhandle,pfVar5,0x1000);
  pbVar6 = btreeblk_get_ops();
  btree_init(&btree,&bhandle,pbVar6,kv_ops,0x1000,'\b','\b',0,&meta);
  if ((btree.root_bid & 0xff000000000000) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x16d);
    subblock_test()::__test_pass = '\x01';
    if ((btree.root_bid & 0xff000000000000) == 0) {
      __assert_fail("is_subblock(btree.root_bid)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x16d,"void subblock_test()");
    }
  }
  if ((btree.root_bid & 0xe0000000000000) != 0x40000000000000) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x16f);
    subblock_test()::__test_pass = 1;
    __assert_fail("subblock_no == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x16f,"void subblock_test()");
  }
  btreeblk_free(&bhandle);
  meta.size = 0xfa;
  btreeblk_init(&bhandle,pfVar5,0x1000);
  pbVar6 = btreeblk_get_ops();
  btree_init(&btree,&bhandle,pbVar6,kv_ops,0x1000,'\b','\b',0,&meta);
  if ((btree.root_bid & 0xff000000000000) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x176);
    subblock_test()::__test_pass = '\x01';
    if ((btree.root_bid & 0xff000000000000) == 0) {
      __assert_fail("is_subblock(btree.root_bid)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x176,"void subblock_test()");
    }
  }
  if ((btree.root_bid & 0xe0000000000000) != 0x60000000000000) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x178);
    subblock_test()::__test_pass = 1;
    __assert_fail("subblock_no == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x178,"void subblock_test()");
  }
  btreeblk_free(&bhandle);
  meta.size = 0x1fe;
  btreeblk_init(&bhandle,pfVar5,0x1000);
  pbVar6 = btreeblk_get_ops();
  btree_init(&btree,&bhandle,pbVar6,kv_ops,0x1000,'\b','\b',0,&meta);
  if ((btree.root_bid & 0xff000000000000) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x17f);
    subblock_test()::__test_pass = '\x01';
    if ((btree.root_bid & 0xff000000000000) == 0) {
      __assert_fail("is_subblock(btree.root_bid)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x17f,"void subblock_test()");
    }
  }
  if ((btree.root_bid & 0xe0000000000000) != 0x80000000000000) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x181);
    subblock_test()::__test_pass = 1;
    __assert_fail("subblock_no == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x181,"void subblock_test()");
  }
  btreeblk_free(&bhandle);
  meta.size = 0x3fc;
  btreeblk_init(&bhandle,pfVar5,0x1000);
  pbVar6 = btreeblk_get_ops();
  btree_init(&btree,&bhandle,pbVar6,kv_ops,0x1000,'\b','\b',0,&meta);
  if ((btree.root_bid & 0xff000000000000) == 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x188);
    subblock_test()::__test_pass = '\x01';
    if ((btree.root_bid & 0xff000000000000) == 0) {
      __assert_fail("is_subblock(btree.root_bid)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                    ,0x188,"void subblock_test()");
    }
  }
  if ((btree.root_bid & 0xe0000000000000) == 0xa0000000000000) {
    btreeblk_free(&bhandle);
    meta.size = 0x7f8;
    btreeblk_init(&bhandle,pfVar5,0x1000);
    pbVar6 = btreeblk_get_ops();
    btree_init(&btree,&bhandle,pbVar6,kv_ops,0x1000,'\b','\b',0,&meta);
    if ((btree.root_bid & 0xff000000000000) != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
              ,0x191);
      subblock_test()::__test_pass = '\x01';
      if ((btree.root_bid & 0xff000000000000) != 0) {
        __assert_fail("!is_subblock(btree.root_bid)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                      ,0x191,"void subblock_test()");
      }
    }
    btreeblk_free(&bhandle);
    meta.size = 0xffa;
    btreeblk_init(&bhandle,pfVar5,0x1000);
    pbVar6 = btreeblk_get_ops();
    bVar1 = btree_init(&btree,&bhandle,pbVar6,kv_ops,0x1000,'\b','\b',0,&meta);
    if (bVar1 == BTREE_RESULT_FAIL) {
      btreeblk_free(&bhandle);
      iVar10 = 1;
      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      free(meta.data);
      system("rm -rf  btreeblock_testfile");
      pfVar4 = get_filemgr_ops();
      fVar14 = filemgr_open("./btreeblock_testfile",pfVar4,&local_11a8,(err_log_callback *)0x0);
      btreeblk_init(&bhandle,fVar14.file,0x1000);
      pbVar6 = btreeblk_get_ops();
      btree_init(&btree,&bhandle,pbVar6,kv_ops,0x1000,'\b','\b',0,(btree_meta *)0x0);
      uVar8 = 0;
      do {
        if (uVar8 == 0x100) {
          btreeblk_free(&bhandle);
          iVar10 = 1;
          filemgr_close(fVar14.file,true,(char *)0x0,(err_log_callback *)0x0);
          filemgr_shutdown();
          system("rm -rf  btreeblock_testfile");
          pfVar4 = get_filemgr_ops();
          fVar14 = filemgr_open("./btreeblock_testfile",pfVar4,&local_11a8,(err_log_callback *)0x0);
          pfVar5 = fVar14.file;
          btreeblk_init(&bhandle,pfVar5,0x1000);
          pbVar6 = btreeblk_get_ops();
          btree_init(&btree,&bhandle,pbVar6,kv_ops,0x1000,'\b','\b',0,(btree_meta *)0x0);
          uVar8 = 0;
          do {
            if (uVar8 == 0x100) {
              btreeblk_free(&bhandle);
              local_1288 = 1;
              filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
              filemgr_shutdown();
              system("rm -rf  btreeblock_testfile");
              pfVar4 = get_filemgr_ops();
              fVar14 = filemgr_open("./btreeblock_testfile",pfVar4,&local_11a8,
                                    (err_log_callback *)0x0);
              btreeblk_init(&bhandle,fVar14.file,0x1000);
              for (lVar13 = 0; lVar13 != 0x70; lVar13 = lVar13 + 0x38) {
                pbVar6 = btreeblk_get_ops();
                btree_init((btree *)(&btree_arr[0].ksize + lVar13),&bhandle,pbVar6,kv_ops,0x1000,
                           '\b','\b',0,(btree_meta *)0x0);
              }
              uVar8 = 0;
              do {
                if (uVar8 == 0x100) {
                  btreeblk_free(&bhandle);
                  filemgr_close(fVar14.file,true,(char *)0x0,(err_log_callback *)0x0);
                  filemgr_shutdown();
                  system("rm -rf  btreeblock_testfile");
                  pfVar4 = get_filemgr_ops();
                  fVar14 = filemgr_open("./btreeblock_testfile",pfVar4,&local_11a8,
                                        (err_log_callback *)0x0);
                  pfVar5 = fVar14.file;
                  btreeblk_init(&bhandle,pfVar5,0x1000);
                  for (lVar13 = 0; lVar13 != 0x70; lVar13 = lVar13 + 0x38) {
                    pbVar6 = btreeblk_get_ops();
                    btree_init((btree *)(&btree_arr[0].ksize + lVar13),&bhandle,pbVar6,kv_ops,0x1000
                               ,'\b','\b',0,(btree_meta *)0x0);
                  }
                  iVar10 = 1;
                  iVar2 = 0;
                  do {
                    if (iVar2 == 0x100) {
                      btreeblk_free(&bhandle);
                      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
                      filemgr_shutdown();
                      system("rm -rf  btreeblock_testfile");
                      pfVar4 = get_filemgr_ops();
                      fVar14 = filemgr_open("./btreeblock_testfile",pfVar4,&local_11a8,
                                            (err_log_callback *)0x0);
                      pfVar5 = fVar14.file;
                      btreeblk_init(&bhandle,pfVar5,0x1000);
                      for (lVar13 = 0; lVar13 != 0x188; lVar13 = lVar13 + 0x38) {
                        pbVar6 = btreeblk_get_ops();
                        btree_init((btree *)(&btree_arr[0].ksize + lVar13),&bhandle,pbVar6,kv_ops,
                                   0x1000,'\b','\b',0,(btree_meta *)0x0);
                      }
                      for (uVar11 = 0; uVar11 != 7; uVar11 = uVar11 + 1) {
                        uVar8 = (0x80 << ((byte)uVar11 & 0x1f)) + -0x10 >> 4;
                        uVar12 = 0;
                        uVar9 = (ulong)uVar8;
                        if ((int)uVar8 < 1) {
                          uVar9 = uVar12;
                        }
                        for (; (int)uVar9 != (int)uVar12; uVar12 = (ulong)((int)uVar12 + 1)) {
                          sprintf(keybuf,"%02d%06d",uVar11 & 0xffffffff,uVar12);
                          sprintf(valuebuf,"%02d%06x",uVar11 & 0xffffffff);
                          btree_insert(btree_arr + uVar11,keybuf,valuebuf);
                          btreeblk_end(&bhandle);
                        }
                        filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
                      }
                      btreeblk_free(&bhandle);
                      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
                      filemgr_shutdown();
                      system("rm -rf  btreeblock_testfile");
                      pfVar4 = get_filemgr_ops();
                      fVar14 = filemgr_open("./btreeblock_testfile",pfVar4,&local_11a8,
                                            (err_log_callback *)0x0);
                      pfVar5 = fVar14.file;
                      btreeblk_init(&bhandle,pfVar5,0x1000);
                      for (lVar13 = 0; lVar13 != 0x188; lVar13 = lVar13 + 0x38) {
                        pbVar6 = btreeblk_get_ops();
                        btree_init((btree *)(&btree_arr[0].ksize + lVar13),&bhandle,pbVar6,kv_ops,
                                   0x1000,'\b','\b',0,(btree_meta *)0x0);
                      }
                      for (uVar11 = 0; uVar11 != 7; uVar11 = uVar11 + 1) {
                        uVar8 = (0x80 << ((byte)uVar11 & 0x1f)) + -0x10 >> 4;
                        uVar12 = 0;
                        uVar9 = (ulong)uVar8;
                        if ((int)uVar8 < 1) {
                          uVar9 = uVar12;
                        }
                        for (; (int)uVar9 != (int)uVar12; uVar12 = (ulong)((int)uVar12 + 1)) {
                          sprintf(keybuf,"%02d%06d",uVar11 & 0xffffffff,uVar12);
                          sprintf(valuebuf,"%02d%06x",uVar11 & 0xffffffff);
                          btree_insert(btree_arr + uVar11,keybuf,valuebuf);
                          btreeblk_end(&bhandle);
                          filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
                        }
                      }
                      btreeblk_free(&bhandle);
                      filemgr_close(pfVar5,true,(char *)0x0,(err_log_callback *)0x0);
                      filemgr_shutdown();
                      free(kv_ops);
                      __format = "%s PASSED\n";
                      if (subblock_test()::__test_pass != '\0') {
                        __format = "%s FAILED\n";
                      }
                      fprintf(_stderr,__format,"subblock test");
                      return;
                    }
                    btree_00 = btree_arr;
                    for (uVar11 = 0; uVar11 != 2; uVar11 = uVar11 + 1) {
                      sprintf(keybuf,"%02d%06d",uVar11 & 0xffffffff,iVar2);
                      sprintf(valuebuf,"%02d%06x",uVar11 & 0xffffffff);
                      btree_insert(btree_00,keybuf,valuebuf);
                      btreeblk_end(&bhandle);
                      btree_00 = btree_00 + 1;
                    }
                    filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
                    for (uVar11 = 0; uVar11 != 2; uVar11 = uVar11 + 1) {
                      for (uVar9 = 0; iVar10 != (int)uVar9; uVar9 = (ulong)((int)uVar9 + 1)) {
                        sprintf(keybuf,"%02d%06d",uVar11 & 0xffffffff,uVar9);
                        sprintf(valuebuf,"%02d%06x",uVar11 & 0xffffffff);
                        btree_find(btree_arr + uVar11,keybuf,temp);
                        btreeblk_end(&bhandle);
                        sVar7 = strlen(valuebuf);
                        iVar3 = bcmp(valuebuf,temp,sVar7);
                        if (iVar3 != 0) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                 );
                          subblock_test()::__test_pass = '\x01';
                          sVar7 = strlen(valuebuf);
                          iVar3 = bcmp(valuebuf,temp,sVar7);
                          if (iVar3 != 0) {
                            __assert_fail("!memcmp(valuebuf, temp, strlen(valuebuf))",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                          ,0x209,"void subblock_test()");
                          }
                        }
                      }
                    }
                    iVar2 = iVar2 + 1;
                    iVar10 = iVar10 + 1;
                  } while( true );
                }
                for (uVar11 = 0; uVar11 != 2; uVar11 = uVar11 + 1) {
                  sprintf(keybuf,"%02d%06d",uVar11 & 0xffffffff,(ulong)uVar8);
                  sprintf(valuebuf,"%02d%06x",uVar11 & 0xffffffff);
                  btree_insert(btree_arr + uVar11,keybuf,valuebuf);
                  btreeblk_end(&bhandle);
                  for (uVar9 = 0; local_1288 != (int)uVar9; uVar9 = (ulong)((int)uVar9 + 1)) {
                    sprintf(keybuf,"%02d%06d",uVar11 & 0xffffffff,uVar9);
                    sprintf(valuebuf,"%02d%06x",uVar11 & 0xffffffff);
                    btree_find(btree_arr + uVar11,keybuf,temp);
                    btreeblk_end(&bhandle);
                    sVar7 = strlen(valuebuf);
                    iVar10 = bcmp(valuebuf,temp,sVar7);
                    if (iVar10 != 0) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                             );
                      subblock_test()::__test_pass = '\x01';
                      sVar7 = strlen(valuebuf);
                      iVar10 = bcmp(valuebuf,temp,sVar7);
                      if (iVar10 != 0) {
                        __assert_fail("!memcmp(valuebuf, temp, strlen(valuebuf))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                      ,0x1e8,"void subblock_test()");
                      }
                    }
                  }
                }
                uVar8 = uVar8 + 1;
                local_1288 = local_1288 + 1;
              } while( true );
            }
            uVar11 = 0;
            sprintf(keybuf,"%08d",(ulong)uVar8);
            sprintf(valuebuf,"%08x",(ulong)uVar8);
            btree_insert(&btree,keybuf,valuebuf);
            btreeblk_end(&bhandle);
            filemgr_commit(pfVar5,true,(err_log_callback *)0x0);
            while( true ) {
              if (iVar10 == (int)uVar11) break;
              sprintf(keybuf,"%08d",uVar11);
              sprintf(valuebuf,"%08x",uVar11);
              btree_find(&btree,keybuf,temp);
              btreeblk_end(&bhandle);
              sVar7 = strlen(valuebuf);
              iVar2 = bcmp(valuebuf,temp,sVar7);
              if (iVar2 != 0) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                       );
                subblock_test()::__test_pass = '\x01';
                sVar7 = strlen(valuebuf);
                iVar2 = bcmp(valuebuf,temp,sVar7);
                if (iVar2 != 0) {
                  __assert_fail("!memcmp(valuebuf, temp, strlen(valuebuf))",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                                ,0x1cb,"void subblock_test()");
                }
              }
              uVar11 = (ulong)((int)uVar11 + 1);
            }
            uVar8 = uVar8 + 1;
            iVar10 = iVar10 + 1;
          } while( true );
        }
        uVar11 = 0;
        sprintf(keybuf,"%08d",(ulong)uVar8);
        sprintf(valuebuf,"%08x",(ulong)uVar8);
        btree_insert(&btree,keybuf,valuebuf);
        btreeblk_end(&bhandle);
        while( true ) {
          if (iVar10 == (int)uVar11) break;
          sprintf(keybuf,"%08d",uVar11);
          sprintf(valuebuf,"%08x",uVar11);
          btree_find(&btree,keybuf,temp);
          btreeblk_end(&bhandle);
          sVar7 = strlen(valuebuf);
          iVar2 = bcmp(valuebuf,temp,sVar7);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                   );
            subblock_test()::__test_pass = '\x01';
            sVar7 = strlen(valuebuf);
            iVar2 = bcmp(valuebuf,temp,sVar7);
            if (iVar2 != 0) {
              __assert_fail("!memcmp(valuebuf, temp, strlen(valuebuf))",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                            ,0x1b1,"void subblock_test()");
            }
          }
          uVar11 = (ulong)((int)uVar11 + 1);
        }
        uVar8 = uVar8 + 1;
        iVar10 = iVar10 + 1;
      } while( true );
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
            ,0x198);
    subblock_test()::__test_pass = 1;
    __assert_fail("br == BTREE_RESULT_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x198,"void subblock_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
          ,0x18a);
  subblock_test()::__test_pass = 1;
  __assert_fail("subblock_no == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x18a,"void subblock_test()");
}

Assistant:

void subblock_test()
{
    TEST_INIT();

    int i, j, k, r, nbtrees;
    int nodesize;
    int blocksize = 4096;
    char *fname = (char *) "./btreeblock_testfile";
    char keybuf[256], valuebuf[256], temp[256];
    filemgr_open_result result;
    btree_result br;
    bid_t bid;
    size_t subblock_no, idx;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct btree_kv_ops *ops;
    struct btree btree, btree_arr[64];
    struct filemgr_config fconfig;
    struct btree_meta meta;

    memset(&fconfig, 0, sizeof(fconfig));
    fconfig.blocksize = blocksize;
    fconfig.ncacheblock = 0;
    fconfig.options = FILEMGR_CREATE;
    fconfig.num_wal_shards = 8;
    ops = btree_kv_get_kb64_vb64(NULL);

    // btree initialization using large metadata test
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    meta.data = (void*)malloc(4096);

    meta.size = 120;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 1);
    btreeblk_free(&bhandle);

    meta.size = 250;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 2);
    btreeblk_free(&bhandle);

    meta.size = 510;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 3);
    btreeblk_free(&bhandle);

    meta.size = 1020;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 4);
    btreeblk_free(&bhandle);

    meta.size = 2040;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(!is_subblock(btree.root_bid));
    btreeblk_free(&bhandle);

    meta.size = 4090;
    btreeblk_init(&bhandle, file, blocksize);
    br = btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(br == BTREE_RESULT_FAIL);

    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();
    free(meta.data);

    // coverage: enlarge case 1-1
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    for (i=0;i<256;++i){
        sprintf(keybuf, "%08d", i);
        sprintf(valuebuf, "%08x", i);
        btree_insert(&btree, (void*)keybuf, (void*)valuebuf);
        btreeblk_end(&bhandle);
        for (j=0;j<=i;++j){
            sprintf(keybuf, "%08d", j);
            sprintf(valuebuf, "%08x", j);
            btree_find(&btree, (void*)keybuf, (void*)temp);
            btreeblk_end(&bhandle);
            TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-2, move case 1
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    for (i=0;i<256;++i){
        sprintf(keybuf, "%08d", i);
        sprintf(valuebuf, "%08x", i);
        btree_insert(&btree, (void*)keybuf, (void*)valuebuf);
        btreeblk_end(&bhandle);
        filemgr_commit(file, true, NULL);
        for (j=0;j<=i;++j){
            sprintf(keybuf, "%08d", j);
            sprintf(valuebuf, "%08x", j);
            btree_find(&btree, (void*)keybuf, (void*)temp);
            btreeblk_end(&bhandle);
            TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 2-1, 2-2, 3-1
    nbtrees = 2;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (i=0;i<256;++i){
        for (j=0;j<nbtrees;++j){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
            for (k=0;k<=i;++k){
                sprintf(keybuf, "%02d%06d", j, k);
                sprintf(valuebuf, "%02d%06x", j, k);
                btree_find(&btree_arr[j], (void*)keybuf, (void*)temp);
                btreeblk_end(&bhandle);
                TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
            }
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-2, 2-1, 3-1, move case 1, 2-1, 2-2
    nbtrees = 2;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (i=0;i<256;++i){
        for (j=0;j<nbtrees;++j){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
        }
        filemgr_commit(file, true, NULL);
        for (j=0;j<nbtrees;++j){
            for (k=0;k<=i;++k){
                sprintf(keybuf, "%02d%06d", j, k);
                sprintf(valuebuf, "%02d%06x", j, k);
                btree_find(&btree_arr[j], (void*)keybuf, (void*)temp);
                btreeblk_end(&bhandle);
                TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
            }
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 2-1, 3-2, move case 1, 2-1
    nbtrees = 7;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (j=0;j<nbtrees;++j){
        nodesize = 128 * (1<<j);
        for (i=0;i<(nodesize-16)/16;++i){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
        }
        filemgr_commit(file, true, NULL);
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 1-2, 2-1, 3-2, move case 1, 2-1
    nbtrees = 7;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (j=0;j<nbtrees;++j){
        nodesize = 128 * (1<<j);
        for (i=0;i<(nodesize-16)/16;++i){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
            filemgr_commit(file, true, NULL);
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    free(ops);
    TEST_RESULT("subblock test");
}